

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  float *this;
  char *pcVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  Vector VVar9;
  undefined1 local_3e0 [8];
  RayTracerTriangles tracer;
  undefined2 local_305;
  char local_302;
  char cStack_301;
  undefined2 local_2ff;
  undefined1 local_2d8 [8];
  Triangle triangle;
  float zz;
  float yy;
  float xx;
  float z;
  float y;
  float x;
  int i;
  undefined1 local_228 [8];
  Triangle tr;
  allocator local_149;
  string local_148 [32];
  RayTracerConfig local_128;
  undefined1 local_98 [8];
  RayTracerConfig config;
  char **argv_local;
  int argc_local;
  
  config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  RayTracerConfig::RayTracerConfig((RayTracerConfig *)local_98);
  if (argc < 2) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Using default config");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    RayTracerConfig::defaultConfig();
    this = &tr.normal.z;
    RayTracerConfig::operator=((RayTracerConfig *)local_98,(RayTracerConfig *)this);
    RayTracerConfig::~RayTracerConfig((RayTracerConfig *)this);
    Triangle::Triangle((Triangle *)local_228);
    tr.x.x = -600.0;
    local_228._0_4_ = 2500.0;
    local_228._4_4_ = -200.0;
    tr.y.x = 0.0;
    tr.x.y = 2500.0;
    tr.x.z = 600.0;
    tr.z.x = 300.0;
    tr.y.y = 2500.0;
    tr.y.z = 200.0;
    tr.z.y._2_1_ = 200;
    tr.z.y._0_2_ = 0;
    tr.z.z._1_1_ = 0;
    tr.z._7_2_ = 200;
    tr.colorX.r = '\0';
    tr.z.z._2_2_ = 0xc800;
    tr.normal.y = 0.1;
    VVar9 = getNormalVector((Triangle *)local_228);
    tr.normal.x = VVar9.z;
    tr._40_8_ = VVar9._0_8_;
    std::vector<Triangle,_std::allocator<Triangle>_>::push_back
              ((vector<Triangle,_std::allocator<Triangle>_> *)
               &config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type *)local_228);
    for (y = 0.0; (int)y < 0x14; y = (float)((int)y + 1)) {
      iVar6 = rand();
      fVar2 = (float)(iVar6 % 5000) + 1000.0;
      iVar6 = rand();
      fVar3 = (float)(iVar6 % 3000) + -800.0;
      iVar6 = rand();
      fVar4 = (float)(iVar6 % 5000) + -2000.0;
      iVar6 = rand();
      iVar7 = rand();
      fVar5 = (float)(iVar7 % 400) + 10.0;
      iVar7 = rand();
      triangle.reflectionCoefficient = (float)(iVar7 % 400) + 10.0;
      Triangle::Triangle((Triangle *)local_2d8);
      local_2d8._4_4_ = fVar3;
      local_2d8._0_4_ = fVar2;
      triangle.y.x = fVar4 + triangle.reflectionCoefficient;
      triangle.x.z = fVar3 + fVar5;
      triangle.x.y = fVar2;
      triangle.y.z = fVar3 + fVar5;
      triangle.y.y = fVar2 + (float)(iVar6 % 400) + 10.0;
      triangle.x.x = fVar4;
      triangle.z.x = fVar4;
      iVar6 = rand();
      iVar7 = rand();
      local_2ff = CONCAT11((char)iVar7 +
                           ((char)(uint)((ulong)((long)iVar7 * 0x51eb851f) >> 0x26) -
                           (char)(iVar7 >> 0x1f)) * '8',
                           (char)iVar6 +
                           ((char)(uint)((ulong)((long)iVar6 * 0x51eb851f) >> 0x26) -
                           (char)(iVar6 >> 0x1f)) * '8');
      iVar6 = rand();
      triangle.z.y._2_1_ =
           (char)iVar6 +
           ((char)(uint)((ulong)((long)iVar6 * 0x51eb851f) >> 0x26) - (char)(iVar6 >> 0x1f)) * '8';
      triangle.z.y._0_2_ = local_2ff;
      iVar6 = rand();
      iVar7 = rand();
      cStack_301 = (char)iVar7 +
                   ((char)(uint)((ulong)((long)iVar7 * 0x51eb851f) >> 0x26) - (char)(iVar7 >> 0x1f))
                   * '8';
      local_302 = (char)iVar6 +
                  ((char)(uint)((ulong)((long)iVar6 * 0x51eb851f) >> 0x26) - (char)(iVar6 >> 0x1f))
                  * '8';
      iVar6 = rand();
      triangle.z.z._1_1_ =
           (char)iVar6 +
           ((char)(uint)((ulong)((long)iVar6 * 0x51eb851f) >> 0x26) - (char)(iVar6 >> 0x1f)) * '8';
      triangle.z._7_2_ = _local_302;
      iVar6 = rand();
      iVar7 = rand();
      local_305 = CONCAT11((char)iVar7 +
                           ((char)(uint)((ulong)((long)iVar7 * 0x51eb851f) >> 0x26) -
                           (char)(iVar7 >> 0x1f)) * '8',
                           (char)iVar6 +
                           ((char)(uint)((ulong)((long)iVar6 * 0x51eb851f) >> 0x26) -
                           (char)(iVar6 >> 0x1f)) * '8');
      iVar6 = rand();
      triangle.colorX.r =
           (char)iVar6 +
           ((char)(uint)((ulong)((long)iVar6 * 0x51eb851f) >> 0x26) - (char)(iVar6 >> 0x1f)) * '8';
      triangle.z.z._2_2_ = local_305;
      triangle.normal.y = 0.1;
      VVar9 = getNormalVector((Triangle *)local_2d8);
      triangle.normal.x = VVar9.z;
      tracer.kdTree = VVar9._0_8_;
      triangle._40_8_ = tracer.kdTree;
      std::vector<Triangle,_std::allocator<Triangle>_>::push_back
                ((vector<Triangle,_std::allocator<Triangle>_> *)
                 &config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(value_type *)local_2d8);
    }
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Reading config from file ");
    poVar8 = std::operator<<(poVar8,*(char **)&((config.triangles.
                                                 super__Vector_base<Triangle,_std::allocator<Triangle>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->x).z);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    pcVar1 = *(char **)&((config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage)->x).z;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,pcVar1,&local_149);
    RayTracerConfig::fromPlyFile(&local_128,(string *)local_148);
    RayTracerConfig::operator=((RayTracerConfig *)local_98,&local_128);
    RayTracerConfig::~RayTracerConfig(&local_128);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    local_98._0_4_ = 2;
    local_98._4_4_ = 1;
    config.super_BaseConfig.antiAliasing = 0x3dcccccd;
    config.super_BaseConfig.maxRecursionLevel = 0x200;
    config.super_BaseConfig.ambientCoefficient = 1.0762e-42;
    config.super_BaseConfig.imageX = 0x400;
    config.super_BaseConfig.observer.x = 0.0;
    config.super_BaseConfig.imageY = 0;
    config.super_BaseConfig.imageZ = 0;
    config.super_BaseConfig.light.x = 200.0;
    config.super_BaseConfig.observer.y = 200.0;
    config.super_BaseConfig.observer.z = 1000.0;
    RayTracerConfig::scaleTriangles((RayTracerConfig *)local_98);
    config.super_BaseConfig.light.y._0_2_ = 0xffff;
    config.super_BaseConfig.light.y._2_1_ = 0xff;
  }
  RayTracerTriangles::RayTracerTriangles
            ((RayTracerTriangles *)local_3e0,(RayTracerConfig *)local_98);
  RayTracerTriangles::processPixels((RayTracerTriangles *)local_3e0);
  RayTracerBase::printBitmap((RayTracerBase *)local_3e0,(ostream *)&std::cout);
  RayTracerTriangles::~RayTracerTriangles((RayTracerTriangles *)local_3e0);
  RayTracerConfig::~RayTracerConfig((RayTracerConfig *)local_98);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  RayTracerConfig config;
  if (argc > 1)
  {
    std::cerr << "Reading config from file " << argv[1] << std::endl;
    config = RayTracerConfig::fromPlyFile(argv[1]);
    config.antiAliasing = 2;
    config.maxRecursionLevel = 1;
    config.ambientCoefficient = 0.1;
    config.imageX = 512;
    config.imageY = 768;
    //config.imageY = 500;
    config.imageZ = 1024;
    //config.imageZ = 500;
    config.observer = {0, 0, 0};
    config.light = {200, 1000, 200};
    config.scaleTriangles();
    config.background = {255, 255, 255};
  }
  else
  {
    std::cerr << "Using default config" << std::endl;
    config = RayTracerConfig::defaultConfig();

    Triangle tr;
    tr.x = {2500, -200, -600};
    tr.y = {2500, 600, 0};
    tr.z = {2500, 200, 300};
    tr.colorX = {0, 0, 200};
    tr.colorY = {200, 0, 0};
    tr.colorZ = {0, 200, 0};
    tr.reflectionCoefficient = 0.1;
    tr.normal = getNormalVector(tr);

    config.triangles.push_back(tr);


    for (int i = 0; i < 20; i++)
    {
      float x = rand() % 5000 + 1000.0;
      float y = rand() % 3000 - 800.0;
      float z = rand() % 5000 - 2000.0;

      float xx = rand() % 400 + 10.0;
      float yy = rand() % 400 + 10.0;
      float zz = rand() % 400 + 10.0;

      Triangle triangle;
      triangle.x = {x, y, z};
      triangle.y = {x, y + yy, z + zz};
      triangle.z = {x + xx, y + yy, z};

      triangle.colorX = {uint8_t(rand() % 200), uint8_t(rand() % 200), uint8_t(rand() % 200)};
      triangle.colorY = {uint8_t(rand() % 200), uint8_t(rand() % 200), uint8_t(rand() % 200)};
      triangle.colorZ = {uint8_t(rand() % 200), uint8_t(rand() % 200), uint8_t(rand() % 200)};
      triangle.reflectionCoefficient = 0.1;
      triangle.normal = getNormalVector(triangle);

      config.triangles.push_back(triangle);
    }
  }
  // std::cerr << config;

  RayTracerTriangles tracer(config);
  tracer.processPixels();
  tracer.printBitmap(std::cout);
}